

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

bool __thiscall YAML::Stream::_ReadAheadTo(Stream *this,size_t i)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  Stream *pSVar4;
  Stream *in_RSI;
  Stream *in_RDI;
  deque<char,_std::allocator<char>_> *__x;
  Stream *in_stack_ffffffffffffffd0;
  
  while( true ) {
    uVar2 = std::ios::good();
    bVar1 = false;
    if ((uVar2 & 1) != 0) {
      pSVar4 = (Stream *)
               std::deque<char,_std::allocator<char>_>::size
                         ((deque<char,_std::allocator<char>_> *)0xf2a919);
      bVar1 = pSVar4 <= in_RSI;
    }
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 = (Stream *)(ulong)in_RDI->m_charSet;
    switch(in_stack_ffffffffffffffd0) {
    case (Stream *)0x0:
      StreamInUtf8(in_stack_ffffffffffffffd0);
      break;
    case (Stream *)0x1:
      StreamInUtf16(in_RDI);
      break;
    case (Stream *)0x2:
      StreamInUtf16(in_RDI);
      break;
    case (Stream *)0x3:
      StreamInUtf32(in_RSI);
      break;
    case (Stream *)0x4:
      StreamInUtf32(in_RSI);
    }
  }
  uVar3 = std::ios::good();
  if ((uVar3 & 1) == 0) {
    __x = &in_RDI->m_readahead;
    eof();
    std::deque<char,_std::allocator<char>_>::push_back
              ((deque<char,_std::allocator<char>_> *)in_stack_ffffffffffffffd0,
               (value_type_conflict3 *)__x);
  }
  pSVar4 = (Stream *)
           std::deque<char,_std::allocator<char>_>::size
                     ((deque<char,_std::allocator<char>_> *)0xf2a9e0);
  return in_RSI < pSVar4;
}

Assistant:

bool Stream::_ReadAheadTo(size_t i) const {
  while (m_input.good() && (m_readahead.size() <= i)) {
    switch (m_charSet) {
      case utf8:
        StreamInUtf8();
        break;
      case utf16le:
        StreamInUtf16();
        break;
      case utf16be:
        StreamInUtf16();
        break;
      case utf32le:
        StreamInUtf32();
        break;
      case utf32be:
        StreamInUtf32();
        break;
    }
  }

  // signal end of stream
  if (!m_input.good())
    m_readahead.push_back(Stream::eof());

  return m_readahead.size() > i;
}